

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O1

SUNErrCode SUNDataNode_GetChild_InMem(SUNDataNode self,sundataindex index,SUNDataNode *child_node)

{
  long *plVar1;
  undefined8 *puVar2;
  
  plVar1 = *(long **)((long)self->content + 0x30);
  if (((plVar1 != (long *)0x0) && (*plVar1 != 0)) || (*(long *)((long)self->content + 0x28) != 0)) {
    puVar2 = (undefined8 *)0x0;
    if ((-1 < index) && (index < *plVar1)) {
      puVar2 = (undefined8 *)(index * 8 + plVar1[2]);
    }
    if (puVar2 != (undefined8 *)0x0) {
      *child_node = (SUNDataNode)*puVar2;
      return 0;
    }
  }
  return -0x26ff;
}

Assistant:

SUNErrCode SUNDataNode_HasChildren_InMem(const SUNDataNode self,
                                         sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);
  *yes_or_no =
    (IMPL_MEMBER(self, anon_children) &&
     SUNStlVector_SUNDataNode_Size(IMPL_MEMBER(self, anon_children)) != 0) ||
    IMPL_MEMBER(self, num_named_children) != 0;
  return SUN_SUCCESS;
}